

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall Imf_3_3::CompositeDeepScanLine::Data::check_valid(Data *this,Header *header)

{
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  Header *this_00;
  Box2i *src;
  ArgExc *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Header *match_header;
  string n;
  ConstIterator i;
  bool has_alpha;
  bool has_z;
  Box<Imath_3_1::Vec2<int>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  Box<Imath_3_1::Vec2<int>_> *in_stack_ffffffffffffff80;
  allocator<char> *__s;
  DeepScanLineInputFile *in_stack_ffffffffffffffa0;
  allocator<char> local_49;
  string local_48 [32];
  const_iterator local_28;
  const_iterator local_20;
  byte local_12;
  byte local_11;
  
  local_11 = 0;
  local_12 = 0;
  Header::channels((Header *)0x19d201);
  local_20._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_ffffffffffffff48);
  while( true ) {
    Header::channels((Header *)0x19d21e);
    local_28._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_ffffffffffffff48);
    bVar1 = Imf_3_3::operator!=((ConstIterator *)in_stack_ffffffffffffff50,
                                (ConstIterator *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 =
         (Box<Imath_3_1::Vec2<int>_> *)ChannelList::ConstIterator::name((ConstIterator *)0x19d259);
    __s = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)__s,(allocator<char> *)in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_49);
    in_stack_ffffffffffffff7f =
         std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    if ((bool)in_stack_ffffffffffffff7f) {
      in_RDI[3]._M_dataplus = (_Alloc_hider)0x1;
    }
    else {
      in_stack_ffffffffffffff7e =
           std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      if ((bool)in_stack_ffffffffffffff7e) {
        local_11 = 1;
      }
      else {
        in_stack_ffffffffffffff7d =
             std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        if ((bool)in_stack_ffffffffffffff7d) {
          local_12 = 1;
        }
      }
    }
    std::__cxx11::string::~string(local_48);
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffff50);
  }
  if ((local_11 & 1) != 0) {
    if ((local_12 & 1) == 0) {
      uVar2 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48)
      ;
      __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    sVar3 = std::
            vector<Imf_3_3::DeepScanLineInputPart_*,_std::allocator<Imf_3_3::DeepScanLineInputPart_*>_>
            ::size((vector<Imf_3_3::DeepScanLineInputPart_*,_std::allocator<Imf_3_3::DeepScanLineInputPart_*>_>
                    *)((long)&in_RDI->field_2 + 8));
    if ((sVar3 == 0) &&
       (sVar3 = std::
                vector<Imf_3_3::DeepScanLineInputFile_*,_std::allocator<Imf_3_3::DeepScanLineInputFile_*>_>
                ::size((vector<Imf_3_3::DeepScanLineInputFile_*,_std::allocator<Imf_3_3::DeepScanLineInputFile_*>_>
                        *)in_RDI), sVar3 == 0)) {
      Header::dataWindow((Header *)0x19d45f);
      Imath_3_1::Box<Imath_3_1::Vec2<int>_>::operator=
                ((Box<Imath_3_1::Vec2<int>_> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      sVar3 = std::
              vector<Imf_3_3::DeepScanLineInputPart_*,_std::allocator<Imf_3_3::DeepScanLineInputPart_*>_>
              ::size((vector<Imf_3_3::DeepScanLineInputPart_*,_std::allocator<Imf_3_3::DeepScanLineInputPart_*>_>
                      *)((long)&in_RDI->field_2 + 8));
      if (sVar3 == 0) {
        std::
        vector<Imf_3_3::DeepScanLineInputFile_*,_std::allocator<Imf_3_3::DeepScanLineInputFile_*>_>
        ::operator[]((vector<Imf_3_3::DeepScanLineInputFile_*,_std::allocator<Imf_3_3::DeepScanLineInputFile_*>_>
                      *)in_RDI,0);
        this_00 = DeepScanLineInputFile::header(in_stack_ffffffffffffffa0);
      }
      else {
        std::
        vector<Imf_3_3::DeepScanLineInputPart_*,_std::allocator<Imf_3_3::DeepScanLineInputPart_*>_>
        ::operator[]((vector<Imf_3_3::DeepScanLineInputPart_*,_std::allocator<Imf_3_3::DeepScanLineInputPart_*>_>
                      *)((long)&in_RDI->field_2 + 8),0);
        this_00 = DeepScanLineInputPart::header((DeepScanLineInputPart *)0x19d4a6);
      }
      src = Header::displayWindow((Header *)0x19d4dc);
      Header::displayWindow((Header *)0x19d4ee);
      bVar1 = Imath_3_1::Box<Imath_3_1::Vec2<int>_>::operator!=
                        ((Box<Imath_3_1::Vec2<int>_> *)this_00,src);
      if (bVar1) {
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc(this_01,(char *)in_stack_ffffffffffffff48);
        __cxa_throw(this_01,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      Header::dataWindow((Header *)0x19d572);
      Imath_3_1::Box<Imath_3_1::Vec2<int>_>::extendBy
                (in_stack_ffffffffffffff80,
                 (Box<Imath_3_1::Vec2<int>_> *)
                 CONCAT17(in_stack_ffffffffffffff7f,
                          CONCAT16(in_stack_ffffffffffffff7e,
                                   CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78))));
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
CompositeDeepScanLine::Data::check_valid (const Header& header)
{

    bool has_z     = false;
    bool has_alpha = false;
    // check good channel names
    for (ChannelList::ConstIterator i = header.channels ().begin ();
         i != header.channels ().end ();
         ++i)
    {
        std::string n (i.name ());
        if (n == "ZBack") { _zback = true; }
        else if (n == "Z") { has_z = true; }
        else if (n == "A") { has_alpha = true; }
    }

    if (!has_z)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine is missing a Z channel");
    }

    if (!has_alpha)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine is missing an alpha channel");
    }

    if (_part.size () == 0 && _file.size () == 0)
    {
        // first in - update and return

        _dataWindow = header.dataWindow ();

        return;
    }

    const Header* const match_header = _part.size () > 0 ? &_part[0]->header ()
                                                         : &_file[0]->header ();

    // check the sizes match
    if (match_header->displayWindow () != header.displayWindow ())
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data");
    }

    _dataWindow.extendBy (header.dataWindow ());
}